

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkShareFindBestMatch(Vec_Ptr_t *vBuckets,Vec_Int_t **pvInput,Vec_Int_t **pvInput2)

{
  int *piVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *p;
  void *Entry;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  bool bVar11;
  int local_74;
  int local_70;
  uint local_6c;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  
  local_74 = 0x28;
  pVVar3 = Vec_PtrAlloc(0x28);
  iVar5 = vBuckets->nSize;
  while (0 < iVar5) {
    iVar5 = iVar5 + -1;
    p = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,iVar5);
    iVar7 = 0;
    while (iVar7 < p->nSize) {
      Entry = Vec_PtrEntry(p,iVar7);
      Vec_PtrPush(pVVar3,Entry);
      iVar7 = iVar7 + 1;
      if (pVVar3->nSize == 0x28) goto LAB_00244d7f;
    }
  }
  local_74 = pVVar3->nSize;
LAB_00244d7f:
  local_58 = (Vec_Int_t *)0x0;
  local_60 = (Vec_Int_t *)0x0;
  local_6c = 0;
  local_70 = 0;
  iVar5 = local_74;
  while (iVar7 = iVar5, 0 < iVar7) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(pVVar3,iVar7 + -1);
    iVar6 = local_74;
    while (iVar8 = iVar6 + -1, iVar5 = iVar7 + -1, 0 < iVar6) {
      p_01 = (Vec_Int_t *)Vec_PtrEntry(pVVar3,iVar8);
      bVar11 = iVar7 != iVar6;
      iVar6 = iVar8;
      if (bVar11) {
        p_00->pArray = p_00->pArray + 2;
        piVar1 = p_01->pArray;
        piVar4 = piVar1 + 2;
        p_01->pArray = piVar4;
        p_00->nSize = p_00->nSize + -2;
        iVar5 = p_01->nSize;
        p_01->nSize = iVar5 + -2;
        piVar2 = p_00->pArray;
        iVar8 = p_00->nSize;
        uVar10 = 0;
        piVar9 = piVar2;
        while ((piVar9 < piVar2 + iVar8 && (piVar4 < piVar1 + iVar5))) {
          if (*piVar9 == *piVar4) {
            piVar9 = piVar9 + 1;
            piVar4 = piVar4 + 1;
            uVar10 = uVar10 + 1;
          }
          else if (*piVar9 < *piVar4) {
            piVar9 = piVar9 + 1;
          }
          else {
            piVar4 = piVar4 + 1;
          }
        }
        p_00->pArray = piVar2 + -2;
        p_01->pArray = p_01->pArray + -2;
        p_00->nSize = iVar8 + 2;
        p_01->nSize = p_01->nSize + 2;
        if (1 < uVar10) {
          iVar8 = Vec_IntEntry(p_00,1);
          iVar5 = Vec_IntEntry(p_01,1);
          if (iVar5 < iVar8) {
            iVar5 = iVar8;
          }
          if (((int)local_6c < (int)uVar10) || ((local_6c == uVar10 && (iVar5 < local_70)))) {
            local_58 = p_01;
            local_60 = p_00;
            local_6c = uVar10;
            local_70 = iVar5;
          }
        }
      }
    }
  }
  Vec_PtrFree(pVVar3);
  *pvInput = local_60;
  *pvInput2 = local_58;
  if (local_60 == (Vec_Int_t *)0x0) {
    return;
  }
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,local_60->nSize + -2);
  Vec_PtrRemove(pVVar3,local_60);
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,local_58->nSize + -2);
  Vec_PtrRemove(pVVar3,local_58);
  return;
}

Assistant:

void Abc_NtkShareFindBestMatch( Vec_Ptr_t * vBuckets, Vec_Int_t ** pvInput, Vec_Int_t ** pvInput2 )
{
    int nPoolSize = 40;
    Vec_Ptr_t * vPool = Vec_PtrAlloc( nPoolSize );
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput, * vInput2, * vInputBest = NULL, * vInputBest2 = NULL;
    int i, k, Cost, CostBest = 0, Delay, DelayBest = 0;

    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vBuckets, vBucket, i )
        Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, k )
        {
            Vec_PtrPush( vPool, vInput );
            if ( Vec_PtrSize(vPool) == nPoolSize )
                goto outside;
        }
outside:

    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput, i )
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput2, k )
    {
        if ( i == k )
            continue;

        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Cost = Vec_IntTwoCountCommon(vInput, vInput2);

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        if ( Cost < 2 )
            continue;

        Delay = Abc_MaxInt( Vec_IntEntry(vInput, 1), Vec_IntEntry(vInput2, 1) );

        if ( CostBest < Cost || (CostBest == Cost && (DelayBest > Delay)) )
        {
            CostBest = Cost;
            DelayBest = Delay;
            vInputBest = vInput;
            vInputBest2 = vInput2;
        }
    }
    Vec_PtrFree( vPool );

    *pvInput  = vInputBest;
    *pvInput2 = vInputBest2;

    if ( vInputBest == NULL )
        return;

    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest)-SHARE_NUM),  (Vec_Int_t *)vInputBest ); 
    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest2)-SHARE_NUM), (Vec_Int_t *)vInputBest2 ); 
}